

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::coinselector_tests::select_coins
          (Result<wallet::SelectionResult> *__return_storage_ptr__,CAmount *target,
          CoinSelectionParams *cs_params,CCoinControl *cc,
          function<wallet::CoinsResult_(wallet::CWallet_&)> *coin_setup,NodeContext *m_node)

{
  long lVar1;
  size_t sVar2;
  T *pTVar3;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar4;
  CAmount *pCVar5;
  iterator pvVar6;
  long *plVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  long local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  undefined1 local_b8 [8];
  __uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> _Stack_b0;
  __uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> local_a8;
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> local_a0;
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> local_98;
  __uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_90;
  __uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_> _Stack_88;
  CoinsResult available_coins;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&available_coins,"",(allocator<char> *)local_b8);
  NewWallet((NodeContext *)&wallet,(string *)m_node);
  std::__cxx11::string::~string((string *)&available_coins);
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::operator()
            (&available_coins,coin_setup,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock21,
             (AnnotatedMixin<std::recursive_mutex> *)
             ((long)wallet._M_t.
                    super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                    .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x1e8),
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             ,0x57a,false);
  local_a0._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)&_Stack_b0;
  local_a8._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (tuple<CConnman_*,_std::default_delete<CConnman>_>)
       (_Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>)0x0;
  local_b8 = (undefined1  [8])0x0;
  _Stack_b0._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
       (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x0;
  local_90._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (_Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)0x0;
  _Stack_88._M_t.super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
  super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
       (tuple<PeerManager_*,_std::default_delete<PeerManager>_>)
       (_Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>)0x0;
  pCVar5 = target;
  local_98._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       local_a0._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
       super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  SelectCoins(__return_storage_ptr__,
              (CWallet *)
              wallet._M_t.
              super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
              super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
              super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,&available_coins,
              (PreSelectedInputs *)local_b8,target,cc,cs_params);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)local_b8);
  if (*(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) ==
      '\x01') {
    pTVar3 = util::Result<wallet::SelectionResult>::value(__return_storage_ptr__);
    psVar4 = SelectionResult::GetInputSet(pTVar3);
    sVar2 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d8 = "";
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)cc;
    msg.m_begin = (iterator)pCVar5;
    file.m_end = (iterator)0x57e;
    file.m_begin = (iterator)&local_e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
    _Stack_b0._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
         (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
         ((ulong)_Stack_b0._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl & 0xffffffffffffff00);
    local_b8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
    local_a8._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
    super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
         (tuple<CConnman_*,_std::default_delete<CConnman>_>)boost::unit_test::lazy_ostream::inst;
    local_a0._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
         (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)((long)"\x05\x04\x03\x02\x01" + 5);
    local_100 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f8 = "";
    local_108 = sVar2 * 0x110 + 0xb0;
    plVar7 = &local_108;
    pvVar6 = (iterator)0x5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::le_impl,unsigned_long,int>
              (local_b8,&local_100,0x57e,1,5,plVar7,"signedTxSize * WITNESS_SCALE_FACTOR",
               &MAX_STANDARD_TX_WEIGHT,"MAX_STANDARD_TX_WEIGHT");
    local_118 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_110 = "";
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)plVar7;
    msg_00.m_begin = pvVar6;
    file_00.m_end = (iterator)0x580;
    file_00.m_begin = (iterator)&local_118;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
               msg_00);
    _Stack_b0._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
         (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
         ((ulong)_Stack_b0._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl & 0xffffffffffffff00);
    local_b8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
    local_a8._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
    super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
         (tuple<CConnman_*,_std::default_delete<CConnman>_>)boost::unit_test::lazy_ostream::inst;
    local_a0._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
         (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)((long)"\x05\x04\x03\x02\x01" + 5);
    local_138 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_130 = "";
    pTVar3 = util::Result<wallet::SelectionResult>::value(__return_storage_ptr__);
    local_108 = SelectionResult::GetSelectedValue(pTVar3);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ge_impl,long,long>
              (local_b8,&local_138,0x580,1,7,&local_108,"result->GetSelectedValue()",target,"target"
              );
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock21.super_unique_lock);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<SelectionResult> select_coins(const CAmount& target, const CoinSelectionParams& cs_params, const CCoinControl& cc, std::function<CoinsResult(CWallet&)> coin_setup, const node::NodeContext& m_node)
{
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    auto available_coins = coin_setup(*wallet);

    LOCK(wallet->cs_wallet);
    auto result = SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/ {}, target, cc, cs_params);
    if (result) {
        const auto signedTxSize = 10 + 34 + 68 * result->GetInputSet().size(); // static header size + output size + inputs size (P2WPKH)
        BOOST_CHECK_LE(signedTxSize * WITNESS_SCALE_FACTOR, MAX_STANDARD_TX_WEIGHT);

        BOOST_CHECK_GE(result->GetSelectedValue(), target);
    }
    return result;
}